

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setQuery(QUrl *this,QUrlQuery *query)

{
  QUrlPrivate *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  QUrlPrivate::clearError(this->d);
  QUrlQuery::query((QString *)&local_38,query,(ComponentFormattingOptions)0x0);
  pQVar1 = this->d;
  pDVar3 = (pQVar1->query).d.d;
  pcVar4 = (pQVar1->query).d.ptr;
  (pQVar1->query).d.d = local_38.d;
  (pQVar1->query).d.ptr = local_38.ptr;
  qVar2 = (pQVar1->query).d.size;
  (pQVar1->query).d.size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pcVar4;
  local_38.size = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  bVar5 = QUrlQuery::isEmpty(query);
  this->d->sectionIsPresent = !bVar5 << 6 | this->d->sectionIsPresent & 0xbf;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setQuery(const QUrlQuery &query)
{
    detach();
    d->clearError();

    // we know the data is in the right format
    d->query = query.toString();
    if (query.isEmpty())
        d->sectionIsPresent &= ~QUrlPrivate::Query;
    else
        d->sectionIsPresent |= QUrlPrivate::Query;
}